

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<int>::Multiply(TPZMatrix<int> *this,TPZFMatrix<int> *A,TPZFMatrix<int> *B,int opt)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  char local_29;
  
  lVar2 = (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
  if (opt == 0) {
    lVar3 = (this->super_TPZBaseMatrix).fRow;
    if (lVar2 != lVar3) goto LAB_00c61d65;
    lVar2 = (A->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
    if ((B->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol == lVar2) goto LAB_00c61d72;
  }
  else {
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    if (lVar2 == lVar3) {
      lVar2 = (A->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
      if ((B->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol == lVar2) {
        if ((this->super_TPZBaseMatrix).fDecomposed != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "virtual void TPZMatrix<int>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = int]"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "\nERROR: Cannot multiply with opt when matrix is decomposed",0x3a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\nAborting...\n",0xd);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
                     ,0x6c8);
        }
        goto LAB_00c61d72;
      }
    }
    else {
LAB_00c61d65:
      lVar2 = (A->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
    }
  }
  (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (B,lVar3,lVar2);
LAB_00c61d72:
  switch((this->super_TPZBaseMatrix).fDecomposed) {
  case '\0':
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(this,A,B,B,1,0,opt);
    return;
  case '\x01':
    TPZFMatrix<int>::operator=(B,A);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x43];
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZMatrix<int>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = int]"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:",0x29);
    local_29 = (this->super_TPZBaseMatrix).fDecomposed;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_29,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nAborting...\n",0xd);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
               ,0x6e2);
  case '\x03':
    TPZFMatrix<int>::operator=(B,A);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])(this,B);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x45];
    break;
  case '\x04':
    TPZFMatrix<int>::operator=(B,A);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x46])(this,B);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x48])(this,B);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x47];
  }
  (*UNRECOVERED_JUMPTABLE)(this,B);
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}